

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

void __thiscall Messages::AddressBook::~AddressBook(AddressBook *this)

{
  SharedDtor(this);
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  google::protobuf::RepeatedPtrField<Messages::Person>::~RepeatedPtrField(&this->people_);
  return;
}

Assistant:

AddressBook::~AddressBook() {
  // @@protoc_insertion_point(destructor:Messages.AddressBook)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}